

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O0

bool __thiscall Time::step(Time *this)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  reference ppTVar6;
  int local_18;
  int i;
  bool allObjectsUpdated;
  bool someObjectsUpdated;
  Time *this_local;
  
  bVar3 = true;
  bVar1 = false;
  while( true ) {
    bVar2 = 0;
    if (bVar3) {
      bVar2 = bVar1 ^ 1;
    }
    if (bVar2 == 0) break;
    bVar3 = false;
    bVar1 = true;
    sVar5 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::size(&this->timeObjects)
    ;
    local_18 = (int)sVar5;
    while (local_18 = local_18 + -1, local_18 != -1) {
      ppTVar6 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::operator[]
                          (&this->timeObjects,(long)local_18);
      uVar4 = (*(*ppTVar6)->_vptr_TimeDependent[5])();
      if ((uVar4 & 1) == 0) {
        ppTVar6 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::operator[]
                            (&this->timeObjects,(long)local_18);
        (*(*ppTVar6)->_vptr_TimeDependent[3])();
        ppTVar6 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::operator[]
                            (&this->timeObjects,(long)local_18);
        uVar4 = (*(*ppTVar6)->_vptr_TimeDependent[5])();
        if ((uVar4 & 1) == 0) {
          bVar1 = false;
        }
        else {
          bVar3 = true;
        }
      }
    }
  }
  if (bVar1 != false) {
    this->timePassed = this->dt + this->timePassed;
  }
  return bVar1;
}

Assistant:

bool Time::step()
{
	// saving flags for update success
	bool someObjectsUpdated = true;
	bool allObjectsUpdated = false;
		
	// while some objects are waiting, but some can still be updated
	while (someObjectsUpdated && !allObjectsUpdated) {
		someObjectsUpdated = false;
		allObjectsUpdated = true;
		
		// try to update all waiting objects
		for (int i=timeObjects.size()-1; i+1; --i) {
			if (!timeObjects[i]->isNextStatePrepared()) {
				
				// update object
				timeObjects[i]->prepareNextState();
				
				// record success of updating
				if (timeObjects[i]->isNextStatePrepared())
					someObjectsUpdated = true;
				else
					allObjectsUpdated = false;
			}
		}
	}
	
	if (allObjectsUpdated)
		timePassed += dt;
	
	return allObjectsUpdated;
}